

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void cf_sha256_digest(cf_sha256_context *ctx,uint8_t *hash)

{
  undefined1 local_88 [8];
  cf_sha256_context ours;
  uint8_t *hash_local;
  cf_sha256_context *ctx_local;
  
  ours.npartial = (size_t)hash;
  memcpy(local_88,ctx,0x70);
  cf_sha256_digest_final((cf_sha256_context *)local_88,(uint8_t *)ours.npartial);
  return;
}

Assistant:

void cf_sha256_digest(const cf_sha256_context *ctx, uint8_t hash[CF_SHA256_HASHSZ])
{
  /* We copy the context, so the finalisation doesn't effect the caller's
   * context.  This means the caller can do:
   *
   * x = init()
   * x.update('hello')
   * h1 = x.digest()
   * x.update(' world')
   * h2 = x.digest()
   *
   * to get h1 = H('hello') and h2 = H('hello world')
   *
   * This wouldn't work if we applied MD-padding to *ctx.
   */

  cf_sha256_context ours = *ctx;
  cf_sha256_digest_final(&ours, hash);
}